

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckArrayCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_9f0 [2];
  TestDetails local_9b0 [2];
  TestDetails local_970 [2];
  TestDetails local_930 [2];
  TestDetails local_8f0;
  float local_8cc;
  int local_8c8 [2];
  int data2 [4];
  int data1 [4];
  undefined1 local_8a0 [8];
  ScopedCurrentTest scopedResults;
  TestDetails testDetails;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  int line;
  TestCheckArrayCloseFailureContainsCorrectDetails *this_local;
  
  reporter._2092_4_ = 0;
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  UnitTest::TestDetails::TestDetails
            ((TestDetails *)&scopedResults.m_oldTestDetails,"arrayCloseTest","arrayCloseSuite",
             "filename",-1);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_8a0,(TestResults *)local_860,
             (TestDetails *)&scopedResults.m_oldTestDetails);
  data2[2] = 0;
  data2[3] = 1;
  local_8c8[0] = 0;
  local_8c8[1] = 1;
  data2[0] = 3;
  data2[1] = 3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8cc = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f0,*ppTVar3,400);
  UnitTest::CheckArrayClose<int[4],int[4],float>
            (pTVar1,(int (*) [4])(data2 + 2),(int (*) [4])local_8c8,4,&local_8cc,&local_8f0);
  reporter._2092_4_ = 400;
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_8a0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_930,*ppTVar3,0x193);
  UnitTest::CheckEqual(pTVar1,"arrayCloseTest",reporter.lastFailedSuite + 0xf8,local_930);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_970,*ppTVar3,0x194);
  UnitTest::CheckEqual(pTVar1,"arrayCloseSuite",reporter.lastFailedFile + 0xfc,local_970);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9b0,*ppTVar3,0x195);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastStartedTest + 0xfc,local_9b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_9f0,*ppTVar3,0x196);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&reporter.field_0x82c,(int *)(reporter.lastFailedFile + 0xf8),local_9f0);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  return;
}

Assistant:

TEST(CheckArrayCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("arrayCloseTest", "arrayCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("arrayCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("arrayCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}